

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe57At7(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ((ulong)(ushort)(*(ushort *)(buf + 5) << 8 | *(ushort *)(buf + 5) >> 8) |
          CONCAT44((uint)buf[2] | (uint)buf[1] << 8 | (uint)*buf << 0x10,
                   (uint)buf[4] << 0x10 | (uint)buf[3] << 0x18) & 0x1ffffffffffff) << 8;
  uVar2 = buf[7] | uVar3;
  uVar1 = uVar2 | 0xfe00000000000000;
  if (uVar3 >> 0x38 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe57At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[7];
    res &= UINT64_C(0x1ffffffffffffff);

    if (res >> 56) {
        res |= UINT64_C(0xfe00000000000000);
    }

    return static_cast<std::int64_t>(res);
}